

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O3

void __thiscall
slang::syntax::StandardCaseItemSyntax::StandardCaseItemSyntax
          (StandardCaseItemSyntax *this,
          SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *expressions,Token colon,
          SyntaxNode *clause)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  undefined4 uVar3;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar4;
  undefined8 uVar5;
  ulong uVar6;
  long lVar7;
  
  uVar5 = colon._0_8_;
  (this->super_CaseItemSyntax).super_SyntaxNode.kind = StandardCaseItem;
  (this->super_CaseItemSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (this->super_CaseItemSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  uVar3 = *(undefined4 *)&(expressions->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar1 = (expressions->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->expressions).super_SyntaxListBase.super_SyntaxNode.kind =
       (expressions->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->expressions).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar3;
  (this->expressions).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (this->expressions).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (expressions->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->expressions).super_SyntaxListBase.childCount =
       (expressions->super_SyntaxListBase).childCount;
  (this->expressions).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_00c94f78;
  sVar2 = (expressions->elements)._M_extent._M_extent_value;
  (this->expressions).elements._M_ptr = (expressions->elements)._M_ptr;
  (this->expressions).elements._M_extent._M_extent_value = sVar2;
  (this->colon).kind = (short)uVar5;
  (this->colon).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->colon).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->colon).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->colon).info = colon.info;
  (this->clause).ptr = clause;
  (this->expressions).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  uVar6 = (this->expressions).elements._M_extent._M_extent_value + 1;
  if (1 < uVar6) {
    uVar6 = uVar6 >> 1;
    lVar7 = 0;
    do {
      ppSVar4 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           ((long)&(((this->expressions).elements._M_ptr)->super_ConstTokenOrSyntax)
                                   .
                                   super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                           + lVar7));
      (*ppSVar4)->parent = (SyntaxNode *)this;
      lVar7 = lVar7 + 0x30;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
    clause = (this->clause).ptr;
  }
  clause->parent = (SyntaxNode *)this;
  return;
}

Assistant:

StandardCaseItemSyntax(const SeparatedSyntaxList<ExpressionSyntax>& expressions, Token colon, SyntaxNode& clause) :
        CaseItemSyntax(SyntaxKind::StandardCaseItem), expressions(expressions), colon(colon), clause(&clause) {
        this->expressions.parent = this;
        for (auto child : this->expressions)
            child->parent = this;
        this->clause->parent = this;
    }